

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O0

TPZTransform<double> * pzshape::TPZShapeQuad::ParametricTransform(int trans_id)

{
  double *pdVar1;
  TPZFMatrix<double> *col;
  int in_ESI;
  TPZTransform<double> *in_RDI;
  TPZTransform<double> *trans;
  int64_t in_stack_ffffffffffffff80;
  int64_t in_stack_ffffffffffffff88;
  TPZFMatrix<double> *in_stack_ffffffffffffff90;
  TPZFMatrix<double> *this;
  undefined8 in_stack_ffffffffffffffa8;
  double dVar2;
  TPZTransform<double> *in_stack_ffffffffffffffb0;
  
  TPZTransform<double>::TPZTransform
            (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (int)in_stack_ffffffffffffffa8);
  dVar2 = *(double *)(gTrans2dQ + (long)in_ESI * 0x20);
  TPZTransform<double>::Mult(in_RDI);
  pdVar1 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80)
  ;
  *pdVar1 = dVar2;
  dVar2 = *(double *)(gTrans2dQ + (long)in_ESI * 0x20 + 8);
  TPZTransform<double>::Mult(in_RDI);
  pdVar1 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80)
  ;
  *pdVar1 = dVar2;
  this = *(TPZFMatrix<double> **)(gTrans2dQ + (long)in_ESI * 0x20 + 0x10);
  TPZTransform<double>::Mult(in_RDI);
  pdVar1 = TPZFMatrix<double>::operator()(this,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  *pdVar1 = (double)this;
  dVar2 = *(double *)(gTrans2dQ + (long)in_ESI * 0x20 + 0x18);
  col = TPZTransform<double>::Mult(in_RDI);
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)pdVar1,(int64_t)col);
  *pdVar1 = dVar2;
  return in_RDI;
}

Assistant:

TPZTransform<REAL> TPZShapeQuad::ParametricTransform(int trans_id){
        TPZTransform<REAL> trans(2,2);
        trans.Mult()(0,0) = gTrans2dQ[trans_id][0][0];
        trans.Mult()(0,1) = gTrans2dQ[trans_id][0][1];
        trans.Mult()(1,0) = gTrans2dQ[trans_id][1][0];
        trans.Mult()(1,1) = gTrans2dQ[trans_id][1][1];
        return trans;
    }